

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

void Bmc_GiaGenerateJustNonRec(Gia_Man_t *p,int iFrame,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  int *piVar8;
  bool bVar9;
  uint uVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int local_64;
  
  if (-1 < iFrame) {
    local_64 = p->nObjs * iFrame;
    do {
      lVar12 = (long)p->nObjs;
      if (0 < lVar12) {
        uVar10 = local_64 - 1;
        lVar19 = lVar12 * 0xc;
        lVar12 = lVar12 + 1;
        do {
          lVar13 = lVar12 + -1;
          iVar2 = p->nObjs;
          if (iVar2 < lVar13) {
LAB_00573e93:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar6 = p->pObjs;
          if (pGVar6 == (Gia_Obj_t *)0x0) break;
          if (lVar12 != 2) {
            uVar16 = *(ulong *)(&pGVar6[-1].field_0x0 + lVar19);
            uVar14 = (uint)uVar16;
            uVar17 = (uint)(uVar16 >> 0x20);
            if (((uVar14 & 0x9fffffff) != 0x9fffffff) ||
               (p->vCis->nSize - p->nRegs <= (int)(uVar17 & 0x1fffffff))) {
              uVar20 = (local_64 + lVar12) - 2;
              if (((long)uVar20 < 0) || (iVar3 = vJustis->nSize, (long)iVar3 <= (long)uVar20))
              goto LAB_00573eb2;
              piVar7 = vJustis->pArray;
              uVar15 = uVar20 >> 5 & 0x7ffffff;
              uVar18 = (uVar10 + (int)lVar12) - 1 & 0x1f;
              if (((uint)piVar7[uVar15] >> uVar18 & 1) != 0) {
                if ((uVar16 & 0x1fffffff) == 0x1fffffff || (int)uVar14 < 0) {
                  if ((int)uVar14 < 0 && (int)(uVar16 & 0x1fffffff) != 0x1fffffff) {
                    uVar17 = (((int)lVar12 + uVar10) - (uVar14 & 0x1fffffff)) - 1;
                  }
                  else {
                    if ((iFrame == 0) || ((uVar14 & 0x9fffffff) != 0x9fffffff)) goto LAB_00573e56;
                    iVar4 = p->vCis->nSize;
                    if ((int)(uVar17 & 0x1fffffff) < iVar4 - p->nRegs) {
                      __assert_fail("Gia_ObjIsRo(p, pObj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                    }
                    iVar5 = p->vCos->nSize;
                    uVar17 = (iVar5 - iVar4) + (uVar17 & 0x1fffffff);
                    if (((int)uVar17 < 0) || (iVar5 <= (int)uVar17)) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                    }
                    iVar4 = p->vCos->pArray[uVar17];
                    if ((iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_00573e93;
                    uVar17 = iVar4 + (local_64 - iVar2);
                  }
                  if (((int)uVar17 < 0) || (iVar3 <= (int)uVar17)) {
LAB_00573ed1:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                  }
                  bVar11 = (byte)uVar17 & 0x1f;
                  uVar20 = (ulong)(uVar17 >> 5);
                }
                else {
                  iVar2 = vValues->nSize;
                  if ((long)iVar2 <= (long)uVar20) {
LAB_00573eb2:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
                  }
                  piVar8 = vValues->pArray;
                  lVar12 = lVar12 + (ulong)uVar10;
                  uVar1 = ((ulong)-(uVar14 & 0x1fffffff) - 1) + lVar12;
                  uVar14 = (uint)uVar1;
                  if (((uint)piVar8[uVar15] >> uVar18 & 1) == 0) {
                    if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_00573eb2;
                    uVar20 = uVar1 >> 5 & 0x7ffffff;
                    bVar11 = (byte)uVar1 & 0x1f;
                    if ((((uint)(uVar16 >> 0x1d) & 7 ^ (uint)piVar8[uVar20] >> bVar11) & 1) != 0) {
                      uVar16 = ((ulong)-(uVar17 & 0x1fffffff) + lVar12) - 1;
                      uVar14 = (uint)uVar16;
                      if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_00573eb2;
                      uVar20 = uVar16 >> 5 & 0x7ffffff;
                      bVar11 = (byte)uVar16 & 0x1f;
                      if (((uVar17 >> 0x1d ^ (uint)piVar8[uVar20] >> bVar11) & 1) != 0) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                                      ,0x61,
                                      "void Bmc_GiaGenerateJustNonRec(Gia_Man_t *, int, Vec_Bit_t *, Vec_Bit_t *)"
                                     );
                      }
                    }
                    if (iVar3 <= (int)uVar14) goto LAB_00573ed1;
                  }
                  else {
                    if (((int)uVar14 < 0) || (iVar3 <= (int)uVar14)) goto LAB_00573ed1;
                    piVar7[uVar14 >> 5] = piVar7[uVar14 >> 5] | 1 << ((byte)uVar1 & 0x1f);
                    uVar17 = ((int)lVar12 - (*(uint *)((long)pGVar6 + lVar19 + -8) & 0x1fffffff)) -
                             1;
                    if (((int)uVar17 < 0) || (vJustis->nSize <= (int)uVar17)) goto LAB_00573ed1;
                    bVar11 = (byte)uVar17 & 0x1f;
                    uVar20 = (ulong)(uVar17 >> 5);
                  }
                }
                piVar7[uVar20] = piVar7[uVar20] | 1 << bVar11;
              }
            }
          }
LAB_00573e56:
          lVar19 = lVar19 + -0xc;
          lVar12 = lVar13;
        } while (1 < lVar13);
      }
      local_64 = local_64 - p->nObjs;
      bVar9 = 0 < iFrame;
      iFrame = iFrame + -1;
    } while (bVar9);
  }
  return;
}

Assistant:

void Bmc_GiaGenerateJustNonRec( Gia_Man_t * p, int iFrame, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int i, k, Shift = Gia_ManObjNum(p) * iFrame;
    for ( i = iFrame; i >= 0; i--, Shift -= Gia_ManObjNum(p) )
    {
        Gia_ManForEachObjReverse( p, pObj, k )
        {
            if ( k == 0 || Gia_ObjIsPi(p, pObj) )
                continue;
            if ( !Vec_BitEntry( vJustis, Shift + k ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Vec_BitEntry( vValues, Shift + k ) )
                {
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                }
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, k) ) == Gia_ObjFaninC0(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, k) ) == Gia_ObjFaninC1(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                else assert( 0 );
            }
            else if ( Gia_ObjIsCo(pObj) )
                Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
            else if ( Gia_ObjIsCi(pObj) && i )
                Vec_BitWriteEntry( vJustis, Shift - Gia_ManObjNum(p) + Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), 1 );
        }
    }
}